

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void raiseSeparatorWidget(QWidget *separatorWidget)

{
  QWidget *this;
  QToolBar **ppQVar1;
  QLayout *object;
  QToolBarLayout *pQVar2;
  QObject *this_00;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBar_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = *(QObject **)(*(long *)&separatorWidget->field_0x8 + 0x10);
  lVar4 = 0;
  QObject::findChildren<QToolBar*>((QList<QToolBar_*> *)&local_48,this_00,(FindChildOptions)0x0);
  ppQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  do {
    if (lVar3 == lVar4) {
      QWidget::raise(separatorWidget,(int)this_00);
LAB_003ccb86:
      QArrayDataPointer<QToolBar_*>::~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    this = *(QWidget **)((long)ppQVar1 + lVar4);
    object = QWidget::layout(this);
    pQVar2 = QtPrivate::qobject_cast_helper<QToolBarLayout*,QObject>(&object->super_QObject);
    if ((pQVar2 != (QToolBarLayout *)0x0) &&
       ((pQVar2->super_QLayout).super_QLayoutItem.field_0xc == '\x01')) {
      QWidget::stackUnder(separatorWidget,this);
      goto LAB_003ccb86;
    }
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

static void raiseSeparatorWidget(QWidget *separatorWidget)
{
    Q_ASSERT(separatorWidget);

#if QT_CONFIG(toolbar)
    // Raise the separator widget, but make sure it doesn't go above
    // an expanded toolbar, as that would break mouse event hit testing.
    Q_ASSERT(separatorWidget->parent());
    const auto toolBars = separatorWidget->parent()->findChildren<QToolBar*>(Qt::FindDirectChildrenOnly);
    for (auto *toolBar : toolBars) {
        if (auto *toolBarLayout = qobject_cast<QToolBarLayout*>(toolBar->layout())) {
            if (toolBarLayout->expanded) {
                separatorWidget->stackUnder(toolBar);
                return;
            }
        }
    }
#endif

    separatorWidget->raise();
}